

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psarrst.c
# Opt level: O0

void * cf2_arrstack_getPointer(CF2_ArrStack arrstack,size_t idx)

{
  void *newPtr;
  size_t idx_local;
  CF2_ArrStack arrstack_local;
  
  newPtr = (void *)idx;
  if (arrstack->count <= idx) {
    cf2_setError(arrstack->error,0x82);
    newPtr = (void *)0x0;
  }
  return (void *)((long)arrstack->ptr + (long)newPtr * arrstack->sizeItem);
}

Assistant:

FT_LOCAL_DEF( void* )
  cf2_arrstack_getPointer( const CF2_ArrStack  arrstack,
                           size_t              idx )
  {
    void*  newPtr;


    FT_ASSERT( arrstack );

    if ( idx >= arrstack->count )
    {
      /* overflow */
      CF2_SET_ERROR( arrstack->error, Stack_Overflow );
      idx = 0;    /* choose safe default */
    }

    newPtr = (FT_Byte*)arrstack->ptr + idx * arrstack->sizeItem;

    return newPtr;
  }